

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,PatternOptions patternOptions)

{
  bool bVar1;
  QDebug *this;
  QByteArray *t;
  QDebugStateSaver *this_00;
  undefined4 in_EDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QByteArray flags;
  QDebugStateSaver saver;
  undefined4 in_stack_ffffffffffffff58;
  PatternOption in_stack_ffffffffffffff5c;
  char t_00;
  QByteArray *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  QFlagsStorage<QRegularExpression::PatternOption> lhs;
  QByteArray *in_stack_ffffffffffffff70;
  QFlagsStorageHelper<QRegularExpression::PatternOption,_4> local_50;
  QFlagsStorageHelper<QRegularExpression::PatternOption,_4> local_4c;
  QFlagsStorage<QRegularExpression::PatternOption> in_stack_ffffffffffffffb8;
  QFlagsStorage<QRegularExpression::PatternOption> in_stack_ffffffffffffffbc;
  QFlagsStorageHelper<QRegularExpression::PatternOption,_4> local_40;
  QFlagsStorageHelper<QRegularExpression::PatternOption,_4> local_3c;
  QFlagsStorageHelper<QRegularExpression::PatternOption,_4> local_38;
  undefined4 local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined4 local_c;
  long local_8;
  
  lhs.i = (Int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_c = in_EDX;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)in_RDI,in_RSI);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)0x73162f);
  local_34 = local_c;
  bVar1 = operator==((QFlags<QRegularExpression::PatternOption>)lhs.i,
                     (PatternOption)in_stack_ffffffffffffff60);
  if (bVar1) {
    QByteArray::operator=
              ((QByteArray *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               (char *)in_RDI);
    t_00 = (char)(in_stack_ffffffffffffff5c >> 0x18);
  }
  else {
    QByteArray::reserve(in_stack_ffffffffffffff70,(qsizetype)in_RDI);
    local_38.super_QFlagsStorage<QRegularExpression::PatternOption>.i =
         (QFlagsStorage<QRegularExpression::PatternOption>)
         QFlags<QRegularExpression::PatternOption>::operator&
                   ((QFlags<QRegularExpression::PatternOption> *)in_stack_ffffffffffffff60,
                    in_stack_ffffffffffffff5c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_38);
    if (bVar1) {
      QByteArray::append(in_stack_ffffffffffffff60,
                         (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
    local_3c.super_QFlagsStorage<QRegularExpression::PatternOption>.i =
         (QFlagsStorage<QRegularExpression::PatternOption>)
         QFlags<QRegularExpression::PatternOption>::operator&
                   ((QFlags<QRegularExpression::PatternOption> *)in_stack_ffffffffffffff60,
                    in_stack_ffffffffffffff5c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_3c);
    if (bVar1) {
      QByteArray::append(in_stack_ffffffffffffff60,
                         (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
    local_40.super_QFlagsStorage<QRegularExpression::PatternOption>.i =
         (QFlagsStorage<QRegularExpression::PatternOption>)
         QFlags<QRegularExpression::PatternOption>::operator&
                   ((QFlags<QRegularExpression::PatternOption> *)in_stack_ffffffffffffff60,
                    in_stack_ffffffffffffff5c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_40);
    if (bVar1) {
      QByteArray::append(in_stack_ffffffffffffff60,
                         (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
    in_stack_ffffffffffffffbc.i =
         (Int)QFlags<QRegularExpression::PatternOption>::operator&
                        ((QFlags<QRegularExpression::PatternOption> *)in_stack_ffffffffffffff60,
                         in_stack_ffffffffffffff5c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&stack0xffffffffffffffbc);
    if (bVar1) {
      QByteArray::append(in_stack_ffffffffffffff60,
                         (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
    in_stack_ffffffffffffffb8.i =
         (Int)QFlags<QRegularExpression::PatternOption>::operator&
                        ((QFlags<QRegularExpression::PatternOption> *)in_stack_ffffffffffffff60,
                         in_stack_ffffffffffffff5c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&stack0xffffffffffffffb8);
    if (bVar1) {
      QByteArray::append(in_stack_ffffffffffffff60,
                         (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
    local_4c.super_QFlagsStorage<QRegularExpression::PatternOption>.i =
         (QFlagsStorage<QRegularExpression::PatternOption>)
         QFlags<QRegularExpression::PatternOption>::operator&
                   ((QFlags<QRegularExpression::PatternOption> *)in_stack_ffffffffffffff60,
                    in_stack_ffffffffffffff5c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_4c);
    if (bVar1) {
      QByteArray::append(in_stack_ffffffffffffff60,
                         (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
    local_50.super_QFlagsStorage<QRegularExpression::PatternOption>.i =
         (QFlagsStorage<QRegularExpression::PatternOption>)
         QFlags<QRegularExpression::PatternOption>::operator&
                   ((QFlags<QRegularExpression::PatternOption> *)in_stack_ffffffffffffff60,
                    in_stack_ffffffffffffff5c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_50);
    if (bVar1) {
      QByteArray::append(in_stack_ffffffffffffff60,
                         (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
    QByteArray::chop(in_stack_ffffffffffffff60,
                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    t_00 = (char)(in_stack_ffffffffffffff5c >> 0x18);
  }
  this = QDebug::nospace(in_RSI);
  t = (QByteArray *)
      QDebug::operator<<((QDebug *)in_RDI,
                         (char *)CONCAT44(in_stack_ffffffffffffffbc.i,in_stack_ffffffffffffffb8.i));
  this_00 = (QDebugStateSaver *)QDebug::operator<<(this,t);
  QDebug::operator<<((QDebug *)this_00,t_00);
  QDebug::QDebug(this,(QDebug *)t);
  QByteArray::~QByteArray((QByteArray *)0x7318bb);
  QDebugStateSaver::~QDebugStateSaver(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDebug)in_RDI;
}

Assistant:

QDebug operator<<(QDebug debug, QRegularExpression::PatternOptions patternOptions)
{
    QDebugStateSaver saver(debug);
    QByteArray flags;

    if (patternOptions == QRegularExpression::NoPatternOption) {
        flags = "NoPatternOption";
    } else {
        flags.reserve(200); // worst case...
        if (patternOptions & QRegularExpression::CaseInsensitiveOption)
            flags.append("CaseInsensitiveOption|");
        if (patternOptions & QRegularExpression::DotMatchesEverythingOption)
            flags.append("DotMatchesEverythingOption|");
        if (patternOptions & QRegularExpression::MultilineOption)
            flags.append("MultilineOption|");
        if (patternOptions & QRegularExpression::ExtendedPatternSyntaxOption)
            flags.append("ExtendedPatternSyntaxOption|");
        if (patternOptions & QRegularExpression::InvertedGreedinessOption)
            flags.append("InvertedGreedinessOption|");
        if (patternOptions & QRegularExpression::DontCaptureOption)
            flags.append("DontCaptureOption|");
        if (patternOptions & QRegularExpression::UseUnicodePropertiesOption)
            flags.append("UseUnicodePropertiesOption|");
        flags.chop(1);
    }

    debug.nospace() << "QRegularExpression::PatternOptions(" << flags << ')';

    return debug;
}